

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec,uchar *tweak32)

{
  uint uVar1;
  uint uVar2;
  int ret;
  int overflow;
  secp256k1_scalar term;
  secp256k1_scalar *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  
  iVar3 = 0;
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffffd0,(uchar *)0x0,
             (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  uVar2 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
  uVar1 = secp256k1_eckey_privkey_tweak_add
                    ((secp256k1_scalar *)
                     (ulong)((CONCAT14(iVar3 != 0,in_stack_ffffffffffffffc0) ^ 0xff00000000) &
                            0x1ffffffff),in_stack_ffffffffffffffb8);
  uVar2 = uVar2 & uVar1;
  secp256k1_scalar_clear((secp256k1_scalar *)0x9421fa);
  return uVar2;
}

Assistant:

static int secp256k1_ec_seckey_tweak_add_helper(secp256k1_scalar *sec, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    int ret = 0;

    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    ret = (!overflow) & secp256k1_eckey_privkey_tweak_add(sec, &term);
    secp256k1_scalar_clear(&term);
    return ret;
}